

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

RangeSelectSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RangeSelectSyntax,slang::syntax::RangeSelectSyntax_const&>
          (BumpAllocator *this,RangeSelectSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  ExpressionSyntax *pEVar3;
  Info *pIVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  RangeSelectSyntax *pRVar10;
  
  pRVar10 = (RangeSelectSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RangeSelectSyntax *)this->endPtr < pRVar10 + 1) {
    pRVar10 = (RangeSelectSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pRVar10 + 1);
  }
  (pRVar10->right).ptr = (args->right).ptr;
  SVar8 = (args->super_SelectorSyntax).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_SelectorSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_SelectorSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_SelectorSyntax).super_SyntaxNode.previewNode;
  pEVar3 = (args->left).ptr;
  uVar5 = (args->range).field_0x2;
  NVar6.raw = (args->range).numFlags.raw;
  uVar7 = (args->range).rawLen;
  pIVar4 = (args->range).info;
  (pRVar10->range).kind = (args->range).kind;
  (pRVar10->range).field_0x2 = uVar5;
  (pRVar10->range).numFlags = (NumericTokenFlags)NVar6.raw;
  (pRVar10->range).rawLen = uVar7;
  (pRVar10->range).info = pIVar4;
  (pRVar10->super_SelectorSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pRVar10->left).ptr = pEVar3;
  (pRVar10->super_SelectorSyntax).super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pRVar10->super_SelectorSyntax).super_SyntaxNode.field_0x4 = uVar9;
  (pRVar10->super_SelectorSyntax).super_SyntaxNode.parent = pSVar1;
  return pRVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }